

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBuffer.cpp
# Opt level: O3

void __thiscall ByteBuffer::_init(ByteBuffer *this,bufsize_t *v_size,bufsize_t *v_padding)

{
  bufsize_t bVar1;
  BYTE *pBVar2;
  BufferException *this_00;
  QString QStack_38;
  
  if (*v_size != 0) {
    pBVar2 = allocContent(this,*v_size,*v_padding);
    this->content = pBVar2;
    this->padding = *v_padding;
    bVar1 = *v_size;
    this->contentSize = bVar1;
    this->originalSize = bVar1;
    return;
  }
  this_00 = (BufferException *)__cxa_allocate_exception(0x48);
  QString::QString(&QStack_38,"Zero size requested");
  BufferException::BufferException(this_00,&QStack_38);
  __cxa_throw(this_00,&BufferException::typeinfo,CustomException::~CustomException);
}

Assistant:

void ByteBuffer::_init(const bufsize_t& v_size, const bufsize_t& v_padding)
{
    if (v_size == 0) throw BufferException("Zero size requested");

    this->content = allocContent(v_size, v_padding);
    if (this->content) {
        this->padding = v_padding;
        this->contentSize = v_size;
        this->originalSize = v_size;
    }
}